

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::socks5_stream::
async_connect<std::_Bind<void(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>
          (socks5_stream *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
          *handler)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  _Bind<void_(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  *this_00;
  query q;
  undefined1 local_e8 [16];
  code *local_d8;
  undefined8 uStack_d0;
  _Bind<void_(libtorrent::socks5_stream::*(libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::function<void_(const_boost::system::error_code_&)>)>
  local_c8;
  basic_resolver_query<boost::asio::ip::tcp> local_90;
  
  uVar1 = *(undefined8 *)&(endpoint->impl_).data_;
  uVar2 = *(undefined8 *)((long)&(endpoint->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(endpoint->impl_).data_ + 0x14);
  *(undefined8 *)((long)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ + 0xc) =
       *(undefined8 *)((long)&(endpoint->impl_).data_ + 0xc);
  *(undefined8 *)((long)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ + 0x14) = uVar3;
  *(undefined8 *)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ = uVar1;
  *(undefined8 *)((long)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ + 8) = uVar2;
  to_string((array<char,_22UL> *)local_e8,(long)(this->super_proxy_base).m_port);
  local_c8._M_f = (offset_in_socks5_stream_to_subr)&local_c8._M_bound_args;
  sVar4 = strlen(local_e8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,local_e8,local_e8 + sVar4);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            (&local_90,&(this->super_proxy_base).m_hostname,(string *)&local_c8,address_configured);
  if ((tuple<libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
       *)local_c8._M_f != &local_c8._M_bound_args) {
    operator_delete((void *)local_c8._M_f,
                    local_c8._M_bound_args.
                    super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>
                    .
                    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>
                    ._M_head_impl.super__Function_base._M_functor._M_unused._M_member_pointer + 1);
  }
  local_d8 = (code *)0x0;
  uStack_d0 = 0;
  local_e8[0] = '\0';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  local_e8[4] = '\0';
  local_e8[5] = '\0';
  local_e8[6] = '\0';
  local_e8[7] = '\0';
  local_e8[8] = '\0';
  local_e8[9] = '\0';
  local_e8[10] = '\0';
  local_e8[0xb] = '\0';
  local_e8[0xc] = '\0';
  local_e8[0xd] = '\0';
  local_e8[0xe] = '\0';
  local_e8[0xf] = '\0';
  this_00 = (_Bind<void_(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
             *)operator_new(0x28);
  std::
  _Bind<void_(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  ::_Bind(this_00,handler);
  local_c8._M_f = (offset_in_socks5_stream_to_subr)name_lookup;
  local_c8._8_8_ = 0;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  ._M_invoker = std::
                _Function_handler<void_(const_boost::system::error_code_&),_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>
                ::_M_invoke;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_functor._8_8_ = local_e8._8_8_;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_boost::system::error_code_&),_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>
       ::_M_manager;
  local_d8 = (code *)0x0;
  uStack_d0 = 0;
  local_e8._0_8_ = this_00;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_functor._M_unused._M_object = this_00;
  local_c8._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Head_base<0UL,_libtorrent::socks5_stream_*,_false>._M_head_impl = this;
  boost::asio::detail::resolver_service<boost::asio::ip::tcp>::
  async_resolve<std::_Bind<void(libtorrent::socks5_stream::*(libtorrent::socks5_stream*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&)>)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ((this->super_proxy_base).m_resolver.impl_.service_,
             &(this->super_proxy_base).m_resolver.impl_.implementation_,&local_90,&local_c8,
             &(this->super_proxy_base).m_resolver.impl_.executor_);
  if (local_c8._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_manager)
              ((_Any_data *)&local_c8._M_bound_args,(_Any_data *)&local_c8._M_bound_args,
               __destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(local_e8,local_e8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.service_name_._M_dataplus._M_p != &local_90.service_name_.field_2) {
    operator_delete(local_90.service_name_._M_dataplus._M_p,
                    local_90.service_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.host_name_._M_dataplus._M_p != &local_90.host_name_.field_2) {
    operator_delete(local_90.host_name_._M_dataplus._M_p,
                    local_90.host_name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		// make sure we don't try to connect to INADDR_ANY. binding is fine,
		// and using a hostname is fine on SOCKS version 5.
		TORRENT_ASSERT(endpoint.address() != address()
			|| (!m_dst_name.empty() && m_version == 5));

		m_remote_endpoint = endpoint;

		// the connect is split up in the following steps:
		// 1. resolve name of proxy server
		// 2. connect to proxy server
		// 3. if version == 5:
		//   3.1 send SOCKS5 authentication method message
		//   3.2 read SOCKS5 authentication response
		//   3.3 send username+password
		// 4. send SOCKS command message

		using std::placeholders::_1;
		using std::placeholders::_2;
		ADD_OUTSTANDING_ASYNC("socks5_stream::name_lookup");
		tcp::resolver::query q(m_hostname, to_string(m_port).data());
		m_resolver.async_resolve(q, std::bind(
			&socks5_stream::name_lookup, this, _1, _2, handler_type(std::move(handler))));
	}